

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::cni_holder(cni_holder<cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *this,_func_numeric_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr **func)

{
  function<cs::numeric_(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *in_RDI;
  cni_helper<cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *this_00;
  function<cs::numeric_(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_ffffffffffffffc0;
  _func_numeric_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006b62d8;
  this_00 = (cni_helper<cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<cs::numeric(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>::
  function<cs::numeric(*const&)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<cs::numeric_(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  ~function((function<cs::numeric_(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *)0x47bfa6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}